

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextStrFromUtf8(ImWchar *buf,int buf_size,char *in_text,char *in_text_end,
                     char **in_text_remaining)

{
  int iVar1;
  uint *in_RCX;
  uint *in_RDX;
  int in_ESI;
  char *in_RDI;
  char *in_R8;
  bool bVar2;
  uint c;
  ImWchar *buf_end;
  ImWchar *buf_out;
  int local_3c;
  char *in_text_end_00;
  uint *local_18;
  
  in_text_end_00 = in_RDI;
  local_18 = in_RDX;
  while( true ) {
    bVar2 = false;
    if ((in_text_end_00 < in_RDI + (long)in_ESI * 2 + -2) &&
       ((in_RCX == (uint *)0x0 || (bVar2 = false, local_18 < in_RCX)))) {
      bVar2 = (char)*local_18 != '\0';
    }
    if (!bVar2) break;
    iVar1 = ImTextCharFromUtf8(in_RCX,in_R8,in_text_end_00);
    local_18 = (uint *)((long)local_18 + (long)iVar1);
    if (local_3c == 0) break;
    *(short *)in_text_end_00 = (short)local_3c;
    in_text_end_00 = in_text_end_00 + 2;
  }
  in_text_end_00[0] = '\0';
  in_text_end_00[1] = '\0';
  if (in_R8 != (char *)0x0) {
    *(uint **)in_R8 = local_18;
  }
  return (int)((long)in_text_end_00 - (long)in_RDI >> 1);
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end - 1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}